

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

void __thiscall kratos::ActiveVisitor::visit(ActiveVisitor *this,SequentialStmtBlock *stmt)

{
  unordered_map<kratos::Port_*,_bool,_std::hash<kratos::Port_*>,_std::equal_to<kratos::Port_*>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>_>
  *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  EventEdgeType EVar2;
  pointer pEVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  VarException *pVVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  pointer pEVar7;
  bool bVar8;
  pair<std::__detail::_Node_iterator<std::pair<kratos::Port_*const,_bool>,_false,_false>,_bool>
  pVar9;
  basic_string_view<char> bVar10;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  initializer_list<const_kratos::IRNode_*> __l_01;
  Port *local_e8;
  SequentialStmtBlock *local_e0;
  Stmt *local_d8;
  ActiveVisitor *local_d0;
  string local_c8;
  undefined1 local_a8 [8];
  shared_ptr<kratos::Port> port_s;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_68;
  SequentialStmtBlock *local_48;
  Port *local_40;
  element_type *port;
  
  pEVar7 = (stmt->conditions_).
           super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar3 = (stmt->conditions_).
           super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = &this->reset_map_;
  local_d0 = this;
  local_48 = stmt;
  do {
    if (pEVar7 == pEVar3) {
      return;
    }
    if (pEVar7->var->type_ == PortIO) {
      EVar2 = pEVar7->edge;
      Var::as<kratos::Port>((Var *)local_a8);
      local_40 = (Port *)local_a8;
      if (*(PortType *)((long)local_a8 + 0x274) == AsyncReset) {
        bVar8 = EVar2 == Posedge;
        if (((*(uint *)((long)local_a8 + 0x278) >> 8 & 1) != 0) &&
           (bVar8 != (bool)(char)*(uint *)((long)local_a8 + 0x278))) {
          pVVar6 = (VarException *)__cxa_allocate_exception(0x10);
          (*(local_40->super_Var).super_IRNode._vptr_IRNode[0x1f])(&local_68);
          port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.
               super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
          bVar10 = fmt::v7::to_string_view<char,_0>
                             ("{0} is declared reset {1} but is used as reset {2}");
          format_str.data_ = (char *)bVar10.size_;
          format_str.size_ = 0xccd;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = in_R9.args_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)
                   &port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          fmt::v7::detail::vformat_abi_cxx11_(&local_c8,(detail *)bVar10.data_,format_str,args);
          local_e8 = local_40;
          local_e0 = local_48;
          __l._M_len = 2;
          __l._M_array = (iterator)&local_e8;
          std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                    ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                     &port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,__l,(allocator_type *)((long)&port + 7));
          VarException::VarException
                    (pVVar6,&local_c8,
                     (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                     &port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          __cxa_throw(pVVar6,&VarException::typeinfo,std::runtime_error::~runtime_error);
        }
        iVar4 = std::
                _Hashtable<kratos::Port_*,_std::pair<kratos::Port_*const,_bool>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Port_*>,_std::hash<kratos::Port_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&this_00->_M_h,&local_40);
        if (iVar4.super__Node_iterator_base<std::pair<kratos::Port_*const,_bool>,_false>._M_cur ==
            (__node_type *)0x0) {
          port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40;
          p_Var1 = &port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          pVar9 = std::
                  _Hashtable<kratos::Port*,std::pair<kratos::Port*const,bool>,std::allocator<std::pair<kratos::Port*const,bool>>,std::__detail::_Select1st,std::equal_to<kratos::Port*>,std::hash<kratos::Port*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  ::_M_emplace<std::pair<kratos::Port*,bool>>
                            ((_Hashtable<kratos::Port*,std::pair<kratos::Port*const,bool>,std::allocator<std::pair<kratos::Port*const,bool>>,std::__detail::_Select1st,std::equal_to<kratos::Port*>,std::hash<kratos::Port*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                              *)this_00,p_Var1);
          port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40;
          std::
          _Hashtable<kratos::Port*,std::pair<kratos::Port*const,bool>,std::allocator<std::pair<kratos::Port*const,bool>>,std::__detail::_Select1st,std::equal_to<kratos::Port*>,std::hash<kratos::Port*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::pair<kratos::Port*,kratos::SequentialStmtBlock*>>
                    ((_Hashtable<kratos::Port*,std::pair<kratos::Port*const,bool>,std::allocator<std::pair<kratos::Port*const,bool>>,std::__detail::_Select1st,std::equal_to<kratos::Port*>,std::hash<kratos::Port*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)this_00,p_Var1,pVar9._8_8_);
        }
        else {
          pmVar5 = std::__detail::
                   _Map_base<kratos::Port_*,_std::pair<kratos::Port_*const,_bool>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Port_*>,_std::hash<kratos::Port_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::at((_Map_base<kratos::Port_*,_std::pair<kratos::Port_*const,_bool>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Port_*>,_std::hash<kratos::Port_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&local_40);
          if (*pmVar5 != bVar8) {
            pVVar6 = (VarException *)__cxa_allocate_exception(0x10);
            (*(local_40->super_Var).super_IRNode._vptr_IRNode[0x1f])(&local_c8);
            local_68.
            super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)local_c8._M_dataplus._M_p;
            local_68.
            super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)local_c8._M_string_length;
            bVar10 = fmt::v7::to_string_view<char,_0>("Inconsistent active low/high usage for {0}");
            format_str_01.data_ = (char *)bVar10.size_;
            format_str_01.size_ = 0xd;
            args_01.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.args_ = in_R9.args_;
            args_01.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)&local_68;
            fmt::v7::detail::vformat_abi_cxx11_
                      ((string *)
                       &port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(detail *)bVar10.data_,format_str_01,args_01);
            local_e8 = local_40;
            local_e0 = local_48;
            local_d8 = get_reset_stmt(local_d0,local_40);
            __l_01._M_len = 3;
            __l_01._M_array = (iterator)&local_e8;
            std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                      (&local_68,__l_01,(allocator_type *)((long)&port + 7));
            VarException::VarException
                      (pVVar6,(string *)
                              &port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount,&local_68);
            __cxa_throw(pVVar6,&VarException::typeinfo,std::runtime_error::~runtime_error);
          }
        }
      }
      else if (*(PortType *)((long)local_a8 + 0x274) == Reset) {
        pVVar6 = (VarException *)__cxa_allocate_exception(0x10);
        (*(local_40->super_Var).super_IRNode._vptr_IRNode[0x1f])(&local_c8);
        local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_c8._M_dataplus._M_p;
        local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_c8._M_string_length;
        bVar10 = fmt::v7::to_string_view<char,_0>
                           ("{0} is used as async reset but is declared synchronous");
        format_str_00.data_ = (char *)bVar10.size_;
        format_str_00.size_ = 0xd;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)&local_68;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)
                   &port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   (detail *)bVar10.data_,format_str_00,args_00);
        local_e8 = local_40;
        local_e0 = local_48;
        __l_00._M_len = 2;
        __l_00._M_array = (iterator)&local_e8;
        std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                  (&local_68,__l_00,(allocator_type *)((long)&port + 7));
        VarException::VarException
                  (pVVar6,(string *)
                          &port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount,&local_68);
        __cxa_throw(pVVar6,&VarException::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&port_s);
    }
    pEVar7 = pEVar7 + 1;
  } while( true );
}

Assistant:

void visit(SequentialStmtBlock* stmt) override {
        auto const& sensitivity = stmt->get_event_controls();
        for (auto const& event : sensitivity) {
            auto t = event.edge;
            auto* v = event.var;
            if (v->type() == VarType::PortIO) {
                auto port_s = v->as<Port>();
                auto* port = port_s.get();
                if (port->port_type() == PortType::AsyncReset) {
                    auto reset_high = t == EventEdgeType::Posedge;
                    // check if we have reset edge set
                    if (port->active_high()) {
                        if (reset_high != (*port->active_high())) {
                            throw VarException(
                                ::format("{0} is declared reset {1} but is used as reset {2}",
                                         port->to_string(), reset_high ? "low" : "high",
                                         reset_high ? "high" : "low"),
                                {port, stmt});
                        }
                    }
                    if (reset_map_.find(port) != reset_map_.end()) {
                        // check consistency
                        if (reset_map_.at(port) != reset_high) {
                            throw VarException(
                                ::format("Inconsistent active low/high usage for {0}",
                                         port->to_string()),
                                {port, stmt, get_reset_stmt(port)});
                        }
                    } else {
                        reset_map_.emplace(std::make_pair(port, reset_high));
                        reset_map_.emplace(std::make_pair(port, stmt));
                    }
                } else if (port->port_type() == PortType::Reset) {
                    throw VarException(
                        ::format("{0} is used as async reset but is declared synchronous",
                                 port->to_string()),
                        {port, stmt});
                }
            }
        }
    }